

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.hpp
# Opt level: O1

void __thiscall
boost::random::
mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
::normalize_state(mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
                  *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = this->x[0x26f] ^ this->x[0x18c];
  uVar2 = uVar3 * 2;
  uVar1 = uVar2 ^ 0x321161bf;
  if (-1 < (int)uVar3) {
    uVar1 = uVar2;
  }
  this->x[0] = uVar1 & 0x7fffffff | this->x[0] & 0x80000000;
  lVar4 = 0;
  do {
    if (this->x[lVar4] != 0) {
      return;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  this->x[0] = 0x80000000;
  return;
}

Assistant:

void normalize_state()
    {
        const UIntType upper_mask = (~static_cast<UIntType>(0)) << r;
        const UIntType lower_mask = ~upper_mask;
        UIntType y0 = x[m-1] ^ x[n-1];
        if(y0 & (static_cast<UIntType>(1) << (w-1))) {
            y0 = ((y0 ^ a) << 1) | 1;
        } else {
            y0 = y0 << 1;
        }
        x[0] = (x[0] & upper_mask) | (y0 & lower_mask);

        // fix up the state if it's all zeroes.
        for(std::size_t j = 0; j < n; ++j) {
            if(x[j] != 0) return;
        }
        x[0] = static_cast<UIntType>(1) << (w-1);
    }